

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.cc
# Opt level: O1

void tvm::contrib::argsort<double,int>(DLTensor *input,DLTensor *output,int32_t axis,bool is_ascend)

{
  iterator __last;
  uint uVar1;
  undefined7 in_register_00000009;
  __normal_iterator<std::pair<long,_double>_*,_std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>
  _Var2;
  long lVar3;
  undefined4 *puVar4;
  long lVar5;
  double *pdVar6;
  long lVar7;
  ulong uVar8;
  vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_> sorter;
  uint local_bc;
  _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<long,_double>_*,_std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>,_std::pair<long,_double>_>
  local_b0;
  __normal_iterator<std::pair<long,_double>_*,_std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>
  local_98;
  iterator iStack_90;
  pair<long,_double> *local_88;
  long local_80;
  ulong local_78;
  undefined4 local_6c;
  ulong local_68;
  long local_60;
  ulong local_58;
  long local_50;
  void *local_48;
  void *local_40;
  ulong local_38;
  
  local_6c = (undefined4)CONCAT71(in_register_00000009,is_ascend);
  local_40 = input->data;
  local_48 = output->data;
  local_98._M_current = (pair<long,_double> *)0x0;
  iStack_90._M_current = (pair<long,_double> *)0x0;
  local_88 = (pair<long,_double> *)0x0;
  lVar5 = (long)axis;
  if ((long)input->ndim < 1) {
    local_bc = 1;
    uVar1 = 1;
  }
  else {
    uVar1 = 1;
    lVar3 = 0;
    local_bc = 1;
    do {
      if (lVar3 < lVar5) {
        uVar1 = uVar1 * (int)input->shape[lVar3];
      }
      else if (lVar5 < lVar3) {
        local_bc = local_bc * (int)input->shape[lVar3];
      }
      lVar3 = lVar3 + 1;
    } while (input->ndim != lVar3);
  }
  if (0 < (int)uVar1) {
    lVar3 = (long)(int)local_bc;
    local_58 = (ulong)uVar1;
    local_38 = (ulong)local_bc;
    local_80 = 0;
    local_68 = 0;
    local_50 = lVar3;
    do {
      if (0 < (int)local_bc) {
        uVar8 = 0;
        do {
          if (iStack_90._M_current != local_98._M_current) {
            iStack_90._M_current = local_98._M_current;
          }
          local_60 = input->shape[lVar5];
          local_78 = uVar8;
          if (0 < local_60) {
            pdVar6 = (double *)((long)local_40 + (local_80 * local_60 + uVar8) * 8);
            lVar7 = 0;
            do {
              local_b0._M_len = (size_type_conflict)*pdVar6;
              local_b0._M_original_len = lVar7;
              if (iStack_90._M_current == local_88) {
                std::vector<std::pair<long,double>,std::allocator<std::pair<long,double>>>::
                _M_realloc_insert<std::pair<long,double>>
                          ((vector<std::pair<long,double>,std::allocator<std::pair<long,double>>> *)
                           &local_98,iStack_90,(pair<long,_double> *)&local_b0);
              }
              else {
                (iStack_90._M_current)->first = lVar7;
                (iStack_90._M_current)->second = (double)local_b0._M_len;
                iStack_90._M_current = iStack_90._M_current + 1;
              }
              lVar7 = lVar7 + 1;
              pdVar6 = pdVar6 + lVar3;
            } while (lVar7 < input->shape[lVar5]);
          }
          uVar8 = local_78;
          __last._M_current = iStack_90._M_current;
          _Var2._M_current = local_98._M_current;
          if ((char)local_6c == '\0') {
            if (local_98._M_current != iStack_90._M_current) {
              lVar7 = (long)iStack_90._M_current - (long)local_98._M_current >> 4;
              std::
              _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<long,_double>_*,_std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>,_std::pair<long,_double>_>
              ::_Temporary_buffer(&local_b0,local_98,(lVar7 - (lVar7 + 1 >> 0x3f)) + 1 >> 1);
              if (local_b0._M_buffer == (pair<long,_double> *)0x0) {
                std::
                __inplace_stable_sort<__gnu_cxx::__normal_iterator<std::pair<long,double>*,std::vector<std::pair<long,double>,std::allocator<std::pair<long,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<long,double>const&,std::pair<long,double>const&)>>
                          (_Var2,(__normal_iterator<std::pair<long,_double>_*,_std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>
                                  )__last._M_current,
                           (_Iter_comp_iter<bool_(*)(const_std::pair<long,_double>_&,_const_std::pair<long,_double>_&)>
                            )0x12d703);
              }
              else {
                std::
                __stable_sort_adaptive<__gnu_cxx::__normal_iterator<std::pair<long,double>*,std::vector<std::pair<long,double>,std::allocator<std::pair<long,double>>>>,std::pair<long,double>*,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<long,double>const&,std::pair<long,double>const&)>>
                          (_Var2,(__normal_iterator<std::pair<long,_double>_*,_std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>
                                  )__last._M_current,local_b0._M_buffer,local_b0._M_len,
                           (_Iter_comp_iter<bool_(*)(const_std::pair<long,_double>_&,_const_std::pair<long,_double>_&)>
                            )0x12d703);
              }
              goto LAB_0012a016;
            }
          }
          else if (local_98._M_current != iStack_90._M_current) {
            lVar7 = (long)iStack_90._M_current - (long)local_98._M_current >> 4;
            std::
            _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<long,_double>_*,_std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>,_std::pair<long,_double>_>
            ::_Temporary_buffer(&local_b0,local_98,(lVar7 - (lVar7 + 1 >> 0x3f)) + 1 >> 1);
            if (local_b0._M_buffer == (pair<long,_double> *)0x0) {
              std::
              __inplace_stable_sort<__gnu_cxx::__normal_iterator<std::pair<long,double>*,std::vector<std::pair<long,double>,std::allocator<std::pair<long,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<long,double>const&,std::pair<long,double>const&)>>
                        (_Var2,(__normal_iterator<std::pair<long,_double>_*,_std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>
                                )__last._M_current,
                         (_Iter_comp_iter<bool_(*)(const_std::pair<long,_double>_&,_const_std::pair<long,_double>_&)>
                          )0x12d6f5);
            }
            else {
              std::
              __stable_sort_adaptive<__gnu_cxx::__normal_iterator<std::pair<long,double>*,std::vector<std::pair<long,double>,std::allocator<std::pair<long,double>>>>,std::pair<long,double>*,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<long,double>const&,std::pair<long,double>const&)>>
                        (_Var2,(__normal_iterator<std::pair<long,_double>_*,_std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>
                                )__last._M_current,local_b0._M_buffer,local_b0._M_len,
                         (_Iter_comp_iter<bool_(*)(const_std::pair<long,_double>_&,_const_std::pair<long,_double>_&)>
                          )0x12d6f5);
            }
LAB_0012a016:
            operator_delete(local_b0._M_buffer,local_b0._M_len << 4);
          }
          lVar7 = input->shape[lVar5];
          if (0 < lVar7) {
            puVar4 = (undefined4 *)((long)local_48 + (local_60 * local_80 + uVar8) * 4);
            _Var2._M_current = local_98._M_current;
            do {
              *puVar4 = (int)(_Var2._M_current)->first;
              puVar4 = puVar4 + lVar3;
              _Var2._M_current = _Var2._M_current + 1;
              lVar7 = lVar7 + -1;
            } while (lVar7 != 0);
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != local_38);
      }
      local_68 = local_68 + 1;
      local_80 = local_80 + local_50;
    } while (local_68 != local_58);
  }
  if (local_98._M_current != (pair<long,_double> *)0x0) {
    operator_delete(local_98._M_current,(long)local_88 - (long)local_98._M_current);
  }
  return;
}

Assistant:

void argsort(DLTensor *input, DLTensor *output, int32_t axis, bool is_ascend) {
  auto data_ptr = static_cast<DataType *>(input->data);
  auto out_ptr = static_cast<OutType *>(output->data);
  std::vector<std::pair<int64_t, DataType>> sorter;

  int axis_mul_before = 1;
  int axis_mul_after = 1;
  for (int i = 0; i < input->ndim; ++i) {
    if (i < axis) {
      axis_mul_before *= input->shape[i];
    } else if (i > axis) {
      axis_mul_after *= input->shape[i];
    }
  }

  for (int i = 0; i < axis_mul_before; ++i) {
    for (int j = 0; j < axis_mul_after; ++j) {
      sorter.clear();
      int64_t base_idx = i * input->shape[axis] * axis_mul_after + j;
      for (int64_t k = 0; k < input->shape[axis]; ++k) {
        int64_t full_idx = base_idx + k * axis_mul_after;
        sorter.emplace_back(std::make_pair(k, data_ptr[full_idx]));
      }
      if (is_ascend) {
        std::stable_sort(sorter.begin(), sorter.end(), CompareAscend<DataType>);
      } else {
        std::stable_sort(sorter.begin(), sorter.end(), CompareDescend<DataType>);
      }
      for (int64_t k = 0; k < input->shape[axis]; ++k) {
        out_ptr[base_idx + k * axis_mul_after] = static_cast<OutType>(sorter[k].first);
      }
    }
  }
}